

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.c
# Opt level: O3

char * utf8_iterate(char *buffer,size_t bufsize,int32_t *codepoint)

{
  byte bVar1;
  size_t sVar2;
  ulong size;
  int32_t value;
  int local_1c;
  
  if (bufsize == 0) {
    return buffer;
  }
  bVar1 = *buffer;
  if ((char)bVar1 < '\0') {
    if ((((bVar1 & 0xfe) == 0xc0 || bVar1 < 0xc0) ||
        (((size = 2, 0xdf < bVar1 && (size = 3, 0xef < bVar1)) && (size = 4, 0xf4 < bVar1)))) ||
       ((bufsize < size || (sVar2 = utf8_check_full(buffer,size,&local_1c), sVar2 == 0)))) {
      return (char *)0x0;
    }
  }
  else {
    size = 1;
    local_1c = (int)(char)bVar1;
  }
  if (codepoint != (int32_t *)0x0) {
    *codepoint = local_1c;
  }
  return buffer + size;
}

Assistant:

const char *utf8_iterate(const char *buffer, size_t bufsize, int32_t *codepoint) {
    size_t count;
    int32_t value;

    if (!bufsize)
        return buffer;

    count = utf8_check_first(buffer[0]);
    if (count <= 0)
        return NULL;

    if (count == 1)
        value = (unsigned char) buffer[0];
    else {
        if (count > bufsize || !utf8_check_full(buffer, count, &value))
            return NULL;
    }

    if (codepoint)
        *codepoint = value;

    return buffer + count;
}